

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O2

unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
__thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::pop(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
      *this)

{
  _Elt_pointer puVar1;
  anon_class_8_1_8991fb9c in_RSI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&(in_RSI.this)->mut_);
  std::condition_variable::
  wait<pstore::broker::message_queue<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>::pop()::_lambda()_1_>
            (&(in_RSI.this)->cv,&uStack_28,in_RSI);
  puVar1 = ((in_RSI.this)->queue_).c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  (this->mut_).super___mutex_base._M_mutex.__align =
       (long)(puVar1->_M_t).
             super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
             .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
  .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
       (message_type *)0x0;
  std::
  deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ::pop_front(&((in_RSI.this)->queue_).c);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
          )(__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
            )this;
}

Assistant:

T message_queue<T>::pop () {
            std::unique_lock<decltype (mut_)> lock (mut_);
            cv.wait (lock, [this] () { return !queue_.empty (); });
            T res = std::move (queue_.front ());
            queue_.pop ();
            return res;
        }